

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall Memory::HeapBlockMap32::~HeapBlockMap32(HeapBlockMap32 *this)

{
  L2MapChunk *obj;
  HeapAllocator *allocator;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x1000; lVar1 = lVar1 + 1) {
    obj = this->map[lVar1];
    if (obj != (L2MapChunk *)0x0) {
      allocator = HeapAllocator::GetNoMemProtectInstance();
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::HeapBlockMap32::L2MapChunk>
                (allocator,obj);
    }
  }
  return;
}

Assistant:

HeapBlockMap32::~HeapBlockMap32()
{
    for (uint i = 0; i < _countof(map); i++)
    {
        L2MapChunk * chunk = map[i];
        if (chunk)
        {
            NoMemProtectHeapDelete(chunk);
        }
    }
}